

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void apx_node_set_name(apx_node_t *self,char *name)

{
  char *pcVar1;
  
  if (self != (apx_node_t *)0x0) {
    if (self->name != (char *)0x0) {
      free(self->name);
    }
    if (name == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = strdup(name);
    }
    self->name = pcVar1;
  }
  return;
}

Assistant:

void apx_node_set_name(apx_node_t* self, const char* name)
{
   if (self != NULL)
   {
      if (self->name != NULL)
      {
         free(self->name);
      }
      if (name != NULL)
      {
         self->name = STRDUP(name);
      }
      else
      {
         self->name = NULL;
      }
   }
}